

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

LBBox3fa * __thiscall
embree::SceneGraph::GridMeshNode::lbounds(LBBox3fa *__return_storage_ptr__,GridMeshNode *this)

{
  undefined1 auVar1 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  ulong uVar4;
  pointer pvVar5;
  size_t size;
  long lVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  avector<BBox<Vec3fa>_> aStack_38;
  
  size = (long)(this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  aStack_38.size_active = 0;
  aStack_38.size_alloced = 0;
  aStack_38.items = (BBox<embree::Vec3fa> *)0x0;
  if (size != 0) {
    aStack_38.items = (BBox<embree::Vec3fa> *)alignedMalloc(size,0x10);
    aStack_38.size_alloced = (long)size >> 5;
  }
  aVar3 = _DAT_002500b0;
  aVar2 = _DAT_002500a0;
  pvVar5 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->positions).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
    uVar4 = 0;
    do {
      aVar7 = aVar3;
      aVar8 = aVar2;
      if (pvVar5[uVar4].size_active != 0) {
        lVar6 = 0;
        do {
          auVar1 = *(undefined1 (*) [16])((long)&(pvVar5[uVar4].items)->field_0 + lVar6);
          aVar8.m128 = (__m128)minps(aVar8.m128,auVar1);
          aVar7.m128 = (__m128)maxps(aVar7.m128,auVar1);
          lVar6 = lVar6 + 0x10;
        } while (pvVar5[uVar4].size_active << 4 != lVar6);
      }
      aStack_38.items[uVar4].lower.field_0 = aVar8;
      aStack_38.items[uVar4].upper.field_0 = aVar7;
      uVar4 = uVar4 + 1;
      pvVar5 = (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 5));
  }
  aStack_38.size_active = aStack_38.size_alloced;
  LBBox<embree::Vec3fa>::LBBox(__return_storage_ptr__,&aStack_38);
  alignedFree(aStack_38.items);
  return __return_storage_ptr__;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        avector<BBox3fa> bboxes(positions.size());
        for (size_t t=0; t<positions.size(); t++) {
          BBox3fa b = empty;
          for (auto& x : positions[t]) b.extend(x);
          bboxes[t] = b;
        }
        return LBBox3fa(bboxes);
      }